

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_InsideMap_Test::TestBody
          (MessageDifferencerTest_IgnoreField_InsideMap_Test *this)

{
  pointer pcVar1;
  void *pvVar2;
  FieldDescriptor *field;
  FieldDescriptor *key;
  FieldDescriptor *field_00;
  Arena *pAVar3;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  MessageDifferencer differencer;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  undefined1 local_340 [432];
  undefined1 local_190 [184];
  undefined1 local_d8 [184];
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_190,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_d8,(Arena *)0x0);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_190 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 5;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0x88),value,pAVar3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),1);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_190 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 2;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 5;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_00._M_str = "bar";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0x88),value_00,pAVar3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),2);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_d8 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 2;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 5;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_01._M_str = "bar";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0x88),value_01,pAVar3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),2);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_d8 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 5;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_02._M_str = "baz";
  value_02._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0x88),value_02,pAVar3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),1);
  pcVar1 = local_340 + 0x10;
  local_340._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"item","");
  field = GetFieldDescriptor((Message *)local_190,(string *)local_340);
  if ((pointer)local_340._0_8_ != pcVar1) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  local_340._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"item.a","");
  key = GetFieldDescriptor((Message *)local_190,(string *)local_340);
  if ((pointer)local_340._0_8_ != pcVar1) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  local_340._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"item.b","");
  field_00 = GetFieldDescriptor((Message *)local_190,(string *)local_340);
  if ((pointer)local_340._0_8_ != pcVar1) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_340);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_340,field_00);
  util::MessageDifferencer::TreatAsMap((MessageDifferencer *)local_340,field,key);
  ExpectEqualsWithDifferencer
            ((MessageDifferencer *)local_340,(Message *)local_190,(Message *)local_d8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_340);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_d8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_190);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_InsideMap) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestDiffMessage::Item* item;

  item = msg1.add_item();
  item->set_a(1);
  item->set_b("foo");
  item->add_ra(1);

  item = msg1.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(1);
  item->set_b("baz");
  item->add_ra(1);

  const FieldDescriptor* item_desc = GetFieldDescriptor(msg1, "item");
  const FieldDescriptor* a = GetFieldDescriptor(msg1, "item.a");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "item.b");

  util::MessageDifferencer differencer;
  differencer.IgnoreField(b);
  differencer.TreatAsMap(item_desc, a);

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}